

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateImpl(IOTHUB_CLIENT_CONFIG *config,char *module_id,_Bool use_dev_auth)

{
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if ((config == (IOTHUB_CLIENT_CONFIG *)0x0) ||
     (config->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar4 = "invalid configuration (NULL detected)";
    iVar3 = 0x688;
  }
  else {
    pIVar1 = initialize_iothub_client
                       (config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,module_id);
    if (pIVar1 != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
      return pIVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar4 = "initialize iothub client";
    iVar3 = 0x68f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_CreateImpl",iVar3,1,pcVar4);
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateImpl(const IOTHUB_CLIENT_CONFIG* config, const char* module_id, bool use_dev_auth)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if(
        (config == NULL) ||
        (config->protocol == NULL)
        )
    {
        result = NULL;
        LogError("invalid configuration (NULL detected)");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = initialize_iothub_client(config, NULL, use_dev_auth, module_id);
        if (handleData == NULL)
        {
            LogError("initialize iothub client");
            result = NULL;
        }
        else
        {
            result = handleData;
        }
    }

    return result;
}